

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

void __thiscall
nite::FileTransfer::UDPClient::request
          (UDPClient *this,IP_Port *client,string *hash,string *output,FTCallback *callback,
          bool overwrite)

{
  bool bVar1;
  Indexer *this_00;
  IndexedFile *file;
  size_t __n;
  void *__buf;
  void *__buf_00;
  int __flags;
  UDPClient *pUVar2;
  undefined1 local_320 [8];
  Packet request;
  string local_a0 [32];
  string local_80 [32];
  FTCallback *local_60;
  undefined1 local_58 [8];
  string id;
  
  if ((this->sock).opened == false) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   "failed to request file \'",hash);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   "\' from server: socket is not open. run listen() first");
    print((string *)local_320);
LAB_0019d1a7:
    std::__cxx11::string::~string((string *)local_320);
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    local_60 = callback;
    bVar1 = fileExists(output);
    if (bVar1) {
      if (!overwrite) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,"cannot request FT to output to \'",output);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_320,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,"\': it already exists and overwritting is not allowed");
        print((string *)local_320);
        goto LAB_0019d1a7;
      }
      removeFile(output);
    }
    this_00 = getIndexer();
    file = Indexer::indexGhostFile(this_00,output,hash);
    Packet::Packet((Packet *)local_320);
    Packet::setHeader((Packet *)local_320,0);
    std::__cxx11::string::string
              ((string *)(request.data + 0x1f8),"",(allocator *)(id.field_2._M_local_buf + 0xf));
    __n = 0;
    pUVar2 = this;
    initFTSession((string *)local_58,file,client,false,this,local_60,
                  (string *)(request.data + 0x1f8));
    __flags = (int)pUVar2;
    std::__cxx11::string::~string((string *)(request.data + 0x1f8));
    std::__cxx11::string::string(local_a0,(string *)hash);
    Packet::write((Packet *)local_320,(int)local_a0,__buf,__n);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::string(local_80,(string *)local_58);
    Packet::write((Packet *)local_320,(int)local_80,__buf_00,__n);
    std::__cxx11::string::~string(local_80);
    UDPSocket::send(&this->sock,(int)client,local_320,__n,__flags);
    std::__cxx11::string::~string((string *)local_58);
    Packet::~Packet((Packet *)local_320);
  }
  return;
}

Assistant:

void nite::FileTransfer::UDPClient::request(	const nite::IP_Port &client,
												const String &hash, 
												const String &output, 
												const nite::FileTransfer::FTCallback &callback,
												bool overwrite){
	if(!sock.opened){
		nite::print("failed to request file '"+hash+"' from server: socket is not open. run listen() first");
		return;
	}
	if(nite::fileExists(output)){
		if(overwrite){
			nite::removeFile(output);
		}else{
			nite::print("cannot request FT to output to '"+output+"': it already exists and overwritting is not allowed");
			return;
		}
	}
	auto indexer = nite::getIndexer();
	auto file = indexer->indexGhostFile(output, hash);
	nite::Packet request;
	request.setHeader(FTHeader::REQUEST);
	auto id = initFTSession(*file, client, false, this, callback);
	request.write(hash);
	request.write(id);
	sock.send(client, request);
}